

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase725::run(TestCase725 *this)

{
  byte *pbVar1;
  TestNetworkAdapter *pTVar2;
  Event **ppEVar3;
  TaskSet *pTVar4;
  undefined8 uVar5;
  long *plVar6;
  WirePointer *pWVar7;
  CapTableReader *pCVar8;
  PromiseNode *pPVar9;
  PromiseFulfiller<void> *pPVar10;
  int iVar11;
  TransformPromiseNodeBase *pTVar12;
  socklen_t in_ECX;
  uint uVar13;
  _Base_ptr p_Var14;
  char *pcVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *pvVar18;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  void *extraout_RDX_11;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  int in_R8D;
  bool bVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> OVar22;
  Own<capnp::ClientHook> OVar23;
  Reader RVar24;
  bool destroyed;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request_1;
  uint oldSentCount;
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  request;
  PromiseFulfillerPair<void> paf;
  TestContext context;
  char local_559;
  undefined1 local_558 [8];
  TransformPromiseNodeBase *pTStack_550;
  Event *local_548;
  TestNetworkAdapter *local_540;
  Event **local_538;
  _Base_ptr p_Stack_530;
  TaskSet *local_528;
  undefined1 local_520 [16];
  long *local_510;
  WirePointer *local_508;
  _Base_ptr local_500;
  _Base_ptr p_Stack_4f8;
  _Base_ptr local_4f0;
  undefined1 local_4e8 [16];
  long *plStack_4d8;
  undefined1 local_4d0 [8];
  undefined8 local_4c8;
  _Base_ptr p_Stack_4c0;
  PointerReader local_4b8;
  uint local_48c;
  undefined1 local_488 [16];
  ExceptionOrValue local_478;
  char local_318;
  Own<kj::_::PromiseNode> local_308;
  Own<kj::PromiseFulfiller<void>_> local_2f8;
  ArrayPtr<const_char> local_2e8;
  Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> local_2d8 [3];
  undefined8 *local_2a8;
  long *local_2a0;
  Maybe<capnp::MessageSize> local_298;
  Maybe<capnp::MessageSize> local_280;
  Maybe<capnp::MessageSize> local_268;
  Maybe<capnp::MessageSize> local_250;
  Maybe<capnp::MessageSize> local_238;
  Maybe<capnp::MessageSize> local_220;
  Maybe<capnp::MessageSize> local_208;
  Maybe<capnp::MessageSize> local_1f0;
  Maybe<capnp::MessageSize> local_1d8;
  Maybe<capnp::MessageSize> local_1c0;
  Maybe<capnp::MessageSize> local_1a8;
  Maybe<capnp::MessageSize> local_190;
  Maybe<capnp::MessageSize> local_178;
  Maybe<capnp::MessageSize> local_160;
  TestContext local_148;
  
  TestContext::TestContext(&local_148);
  kj::newPromiseAndFulfiller<void>();
  local_559 = '\0';
  pTVar12 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar12,&local_308,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:730:46),_kj::_::PropagateException>
             ::anon_class_8_1_8c041cb9_for_func::operator());
  (pTVar12->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0060e1a0;
  pTVar12[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_559;
  local_558 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase725::run()::$_0,kj::_::PropagateException>>
               ::instance;
  pTStack_550 = pTVar12;
  OVar22 = kj::heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                     ((kj *)&local_478,(Own<kj::_::PromiseNode> *)local_558);
  pTVar12 = pTStack_550;
  local_488._0_4_ = local_478.exception.ptr._0_4_;
  local_488._4_4_ = local_478.exception.ptr._4_4_;
  local_488._12_4_ = local_478.exception.ptr.field_1._4_4_;
  local_488._8_4_ = local_478.exception.ptr.field_1._0_4_;
  if (pTStack_550 != (TransformPromiseNodeBase *)0x0) {
    pTStack_550 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_558)->arena->_vptr_Arena)
              (local_558,
               (pTVar12->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&(pTVar12->super_PromiseNode)._vptr_PromiseNode,OVar22.ptr);
  }
  TestContext::connect((TestContext *)local_558,(int)&local_148,(sockaddr *)0x5,in_ECX);
  (*(pTStack_550->super_PromiseNode)._vptr_PromiseNode[4])(&local_478);
  pTVar12 = pTStack_550;
  local_4e8._8_4_ = local_478.exception.ptr._0_4_;
  local_4e8._12_4_ = local_478.exception.ptr._4_4_;
  plStack_4d8 = (long *)CONCAT44(local_478.exception.ptr.field_1._4_4_,
                                 local_478.exception.ptr.field_1._0_4_);
  local_4e8._0_8_ = &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
  if (pTStack_550 != (TransformPromiseNodeBase *)0x0) {
    pTStack_550 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_558)->arena->_vptr_Arena)
              (local_558,
               (pTVar12->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&(pTVar12->super_PromiseNode)._vptr_PromiseNode);
  }
  local_160.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::holdRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
              *)&local_478,(Client *)local_4e8,&local_160);
  kj::heap<capnp::_::TestCapDestructor,kj::Own<kj::PromiseFulfiller<void>>>
            ((kj *)&local_4b8,&local_2f8);
  p_Var16 = (_Base_ptr)local_4b8.capTable;
  local_558 = (undefined1  [8])CONCAT44(local_4b8.segment._4_4_,(uint)local_4b8.segment);
  pTStack_550 = (TransformPromiseNodeBase *)((long)local_4b8.capTable + 0x40);
  if ((_Base_ptr)local_4b8.capTable == (_Base_ptr)0x0) {
    pTStack_550 = (TransformPromiseNodeBase *)0x0;
  }
  local_4b8.capTable = (CapTableReader *)0x0;
  OVar23 = Capability::Client::makeLocalClient
                     ((Client *)(local_520 + 8),(Own<capnp::Capability::Server> *)local_558);
  pTVar12 = pTStack_550;
  if ((_Base_ptr)pTStack_550 != (_Base_ptr)0x0) {
    pTStack_550 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_558)->arena->_vptr_Arena)
              (local_558,(*(_func_int ***)pTVar12)[-2] + (long)&pTVar12->super_PromiseNode,
               OVar23.ptr);
  }
  local_520._0_8_ = &Capability::Client::typeinfo;
  local_558 = (undefined1  [8])CONCAT44(local_478.exception.ptr._4_4_,local_478.exception.ptr._0_4_)
  ;
  pTStack_550 = (TransformPromiseNodeBase *)
                CONCAT44(local_478.exception.ptr.field_1._4_4_,local_478.exception.ptr.field_1._0_4_
                        );
  local_548 = (Event *)local_478.exception.ptr.field_1.value.ownFile.content.disposer;
  PointerBuilder::setCapability
            ((PointerBuilder *)local_558,(Own<capnp::ClientHook> *)(local_520 + 8));
  plVar6 = local_510;
  pvVar18 = extraout_RDX;
  if (local_510 != (long *)0x0) {
    local_510 = (long *)0x0;
    (**((CapTableReader *)local_520._8_8_)->_vptr_CapTableReader)
              (local_520._8_8_,*(long *)(*plVar6 + -0x10) + (long)plVar6);
    pvVar18 = extraout_RDX_00;
  }
  pCVar8 = local_4b8.capTable;
  if (local_4b8.capTable != (CapTableReader *)0x0) {
    local_4b8.capTable = (CapTableReader *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_4b8.segment._4_4_,(uint)local_4b8.segment))
              ((undefined8 *)CONCAT44(local_4b8.segment._4_4_,(uint)local_4b8.segment),
               pCVar8->_vptr_CapTableReader[-2] + (long)&pCVar8->_vptr_CapTableReader);
    pvVar18 = extraout_RDX_01;
  }
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
          *)local_558,(int)&local_478,pvVar18,(size_t)p_Var16,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>::wait
            (local_2d8,local_558);
  plVar6 = local_2a0;
  if (local_2a0 != (long *)0x0) {
    local_2a0 = (long *)0x0;
    (**(code **)*local_2a8)(local_2a8,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  p_Var14 = p_Stack_530;
  ppEVar3 = local_538;
  if (local_538 != (Event **)0x0) {
    local_538 = (Event **)0x0;
    p_Stack_530 = (_Base_ptr)0x0;
    p_Var16 = p_Var14;
    (*(code *)local_528->errorHandler->_vptr_ErrorHandler)(local_528,ppEVar3,8,p_Var14,p_Var14,0);
    in_R8D = (int)p_Var16;
    p_Var16 = p_Var14;
  }
  pTVar2 = local_540;
  if (local_540 != (TestNetworkAdapter *)0x0) {
    local_540 = (TestNetworkAdapter *)0x0;
    (**local_548->_vptr_Event)
              (local_548,
               (long)&(pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                      _vptr_VatNetworkBase +
               (long)((Event *)
                     (pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                     _vptr_VatNetworkBase)[-1].prev);
  }
  pTVar12 = pTStack_550;
  if (pTStack_550 != (TransformPromiseNodeBase *)0x0) {
    pTStack_550 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_558)->arena->_vptr_Arena)
              (local_558,
               (pTVar12->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&pTVar12->super_PromiseNode);
  }
  uVar5 = local_478.exception.ptr.field_1.value.description.content.ptr;
  if ((Impl *)local_478.exception.ptr.field_1.value.description.content.ptr != (Impl *)0x0) {
    local_478.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_478.exception.ptr.field_1.value.type,
                         local_478.exception.ptr.field_1.value.line))
              ((undefined8 *)
               CONCAT44(local_478.exception.ptr.field_1.value.type,
                        local_478.exception.ptr.field_1.value.line),
               (char *)(uVar5 + *(long *)(*(long *)uVar5 + -0x10)));
  }
  local_178.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_520,
             (Client *)
             (&((Client *)local_4e8)->field_0x0 +
             (long)*(pointer_____offset_0x10___ *)(local_4e8._0_8_ + -0x20)),&local_178);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_558,(int)local_520,__buf,(size_t)p_Var16,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_478,local_558);
  uVar5 = local_478.exception.ptr.field_1.value.description.content.size_;
  bVar19 = true;
  if (0x1f < (uint)local_478.exception.ptr.field_1._24_4_) {
    bVar19 = *(int *)local_478.exception.ptr.field_1.value.ownFile.content.size_ != 1;
  }
  if ((long *)local_478.exception.ptr.field_1.value.description.content.size_ != (long *)0x0) {
    local_478.exception.ptr.field_1.value.description.content.size_ = 0;
    (*(code *)**(undefined8 **)local_478.exception.ptr.field_1.value.description.content.ptr)
              (local_478.exception.ptr.field_1.value.description.content.ptr,
               uVar5 + *(long *)(*(long *)uVar5 + -0x10));
  }
  p_Var14 = p_Stack_530;
  ppEVar3 = local_538;
  if (local_538 != (Event **)0x0) {
    local_538 = (Event **)0x0;
    p_Stack_530 = (_Base_ptr)0x0;
    p_Var16 = p_Var14;
    (*(code *)local_528->errorHandler->_vptr_ErrorHandler)(local_528,ppEVar3,8,p_Var14,p_Var14,0);
    in_R8D = (int)p_Var16;
    p_Var16 = p_Var14;
  }
  pTVar2 = local_540;
  if (local_540 != (TestNetworkAdapter *)0x0) {
    local_540 = (TestNetworkAdapter *)0x0;
    (**local_548->_vptr_Event)
              (local_548,
               (long)&(pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                      _vptr_VatNetworkBase +
               (long)((Event *)
                     (pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                     _vptr_VatNetworkBase)[-1].prev);
  }
  pTVar12 = pTStack_550;
  if (pTStack_550 != (TransformPromiseNodeBase *)0x0) {
    pTStack_550 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_558)->arena->_vptr_Arena)
              (local_558,
               (pTVar12->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&pTVar12->super_PromiseNode);
  }
  p_Var14 = local_4f0;
  if (local_4f0 != (_Base_ptr)0x0) {
    local_4f0 = (_Base_ptr)0x0;
    (***(_func_int ***)p_Stack_4f8)
              (p_Stack_4f8,*(long *)(*(long *)p_Var14 + -0x10) + (long)&p_Var14->_M_color);
  }
  pcVar15 = (char *)CONCAT71((int7)((ulong)p_Var16 >> 8),kj::_::Debug::minSeverity < 3);
  if ((bool)(bVar19 & kj::_::Debug::minSeverity < 3)) {
    local_4b8.segment._0_4_ = 1;
    local_190.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                *)local_520,
               (Client *)
               (&((Client *)local_4e8)->field_0x0 +
               (long)*(pointer_____offset_0x10___ *)(local_4e8._0_8_ + -0x20)),&local_190);
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
            *)local_558,(int)local_520,__buf_00,(size_t)pcVar15,in_R8D);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_478,local_558);
    local_4d0._0_4_ = 0;
    if (0x1f < (uint)local_478.exception.ptr.field_1._24_4_) {
      local_4d0._0_4_ = *(undefined4 *)local_478.exception.ptr.field_1.value.ownFile.content.size_;
    }
    pcVar15 = 
    "\"failed: expected \" \"(1) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 1, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
    ;
    in_R8D = 0x4d93cf;
    kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2e7,ERROR,
               "\"failed: expected \" \"(1) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 1, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
               ,(char (*) [96])
                "failed: expected (1) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
               ,(int *)&local_4b8,(uint *)local_4d0);
    uVar5 = local_478.exception.ptr.field_1.value.description.content.size_;
    if ((long *)local_478.exception.ptr.field_1.value.description.content.size_ != (long *)0x0) {
      local_478.exception.ptr.field_1.value.description.content.size_ = 0;
      (*(code *)**(undefined8 **)local_478.exception.ptr.field_1.value.description.content.ptr)
                (local_478.exception.ptr.field_1.value.description.content.ptr,
                 uVar5 + *(long *)(*(long *)uVar5 + -0x10));
    }
    p_Var16 = p_Stack_530;
    ppEVar3 = local_538;
    if (local_538 != (Event **)0x0) {
      local_538 = (Event **)0x0;
      p_Stack_530 = (_Base_ptr)0x0;
      p_Var14 = p_Var16;
      (*(code *)local_528->errorHandler->_vptr_ErrorHandler)(local_528,ppEVar3,8,p_Var16,p_Var16,0);
      in_R8D = (int)p_Var14;
      pcVar15 = (char *)p_Var16;
    }
    pTVar2 = local_540;
    if (local_540 != (TestNetworkAdapter *)0x0) {
      local_540 = (TestNetworkAdapter *)0x0;
      (**local_548->_vptr_Event)
                (local_548,
                 (long)&(pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                        _vptr_VatNetworkBase +
                 (long)((Event *)
                       (pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                       _vptr_VatNetworkBase)[-1].prev);
    }
    pTVar12 = pTStack_550;
    if (pTStack_550 != (TransformPromiseNodeBase *)0x0) {
      pTStack_550 = (TransformPromiseNodeBase *)0x0;
      (*(code *)((SegmentReader *)local_558)->arena->_vptr_Arena)
                (local_558,
                 (pTVar12->super_PromiseNode)._vptr_PromiseNode[-2] +
                 (long)&pTVar12->super_PromiseNode);
    }
    p_Var16 = local_4f0;
    if (local_4f0 != (_Base_ptr)0x0) {
      local_4f0 = (_Base_ptr)0x0;
      (***(_func_int ***)p_Stack_4f8)
                (p_Stack_4f8,*(long *)(*(long *)p_Var16 + -0x10) + (long)&p_Var16->_M_color);
    }
  }
  if ((local_559 == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    pcVar15 = "\"failed: expected \" \"!(destroyed)\"";
    in_R8D = 0x4a9b0f;
    kj::_::Debug::log<char_const(&)[30]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2ea,ERROR,"\"failed: expected \" \"!(destroyed)\"",
               (char (*) [30])"failed: expected !(destroyed)");
  }
  local_1a8.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::callHeldRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
              *)local_520,(Client *)local_4e8,&local_1a8);
  Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
          *)local_558,(int)local_520,__buf_01,(size_t)pcVar15,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
              *)&local_478,local_558);
  bVar19 = local_478.exception.ptr.field_1._28_2_ == 0;
  local_4b8.pointer = (WirePointer *)local_478.exception.ptr.field_1.value.ownFile.content.disposer;
  if (bVar19) {
    local_4b8.pointer = (WirePointer *)(Event *)0x0;
  }
  pcVar15 = (char *)0x7fffffff;
  if (!bVar19) {
    pcVar15 = (char *)(ulong)(uint)local_478.exception.ptr.field_1.value.line;
  }
  local_4b8.segment._0_4_ = 0;
  local_4b8.segment._4_4_ = 0;
  uVar20 = 0;
  uVar21 = 0;
  if (!bVar19) {
    local_4b8.segment._0_4_ = local_478.exception.ptr._0_4_;
    local_4b8.segment._4_4_ = local_478.exception.ptr._4_4_;
    uVar20 = local_478.exception.ptr.field_1._0_4_;
    uVar21 = local_478.exception.ptr.field_1._4_4_;
  }
  local_4b8.capTable = (CapTableReader *)CONCAT44(uVar21,uVar20);
  local_4b8.nestingLimit = (int)pcVar15;
  RVar24 = PointerReader::getBlob<capnp::Text>(&local_4b8,(void *)0x0,0);
  uVar5 = local_478.exception.ptr.field_1.value.description.content.size_;
  bVar19 = true;
  if (RVar24.super_StringPtr.content.size_ == 4) {
    uVar13 = *RVar24.super_StringPtr.content.ptr ^ 0x6162;
    pcVar15 = (char *)(ulong)uVar13;
    bVar19 = (char)RVar24.super_StringPtr.content.ptr[1] != 'r' || (short)uVar13 != 0;
  }
  if ((long *)local_478.exception.ptr.field_1.value.description.content.size_ != (long *)0x0) {
    local_478.exception.ptr.field_1.value.description.content.size_ = 0;
    (*(code *)**(undefined8 **)local_478.exception.ptr.field_1.value.description.content.ptr)
              (local_478.exception.ptr.field_1.value.description.content.ptr,
               uVar5 + *(long *)(*(long *)uVar5 + -0x10));
  }
  p_Var16 = p_Stack_530;
  ppEVar3 = local_538;
  if (local_538 != (Event **)0x0) {
    local_538 = (Event **)0x0;
    p_Stack_530 = (_Base_ptr)0x0;
    p_Var14 = p_Var16;
    (*(code *)local_528->errorHandler->_vptr_ErrorHandler)(local_528,ppEVar3,8,p_Var16,p_Var16,0);
    in_R8D = (int)p_Var14;
    pcVar15 = (char *)p_Var16;
  }
  pTVar2 = local_540;
  if (local_540 != (TestNetworkAdapter *)0x0) {
    local_540 = (TestNetworkAdapter *)0x0;
    (**local_548->_vptr_Event)
              (local_548,
               (long)&(pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                      _vptr_VatNetworkBase +
               (long)((Event *)
                     (pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                     _vptr_VatNetworkBase)[-1].prev);
  }
  pTVar12 = pTStack_550;
  if (pTStack_550 != (TransformPromiseNodeBase *)0x0) {
    pTStack_550 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_558)->arena->_vptr_Arena)
              (local_558,
               (pTVar12->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&pTVar12->super_PromiseNode);
  }
  p_Var16 = local_4f0;
  if (local_4f0 != (_Base_ptr)0x0) {
    local_4f0 = (_Base_ptr)0x0;
    (***(_func_int ***)p_Stack_4f8)
              (p_Stack_4f8,*(long *)(*(long *)p_Var16 + -0x10) + (long)&p_Var16->_M_color);
  }
  if ((bool)(bVar19 & kj::_::Debug::minSeverity < 3)) {
    local_1c0.ptr.isSet = false;
    capnproto_test::capnp::test::TestMoreStuff::Client::callHeldRequest
              ((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
                *)local_520,(Client *)local_4e8,&local_1c0);
    Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
    ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
            *)local_558,(int)local_520,__buf_02,(size_t)pcVar15,in_R8D);
    kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::wait
              ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
                *)&local_478,local_558);
    bVar19 = local_478.exception.ptr.field_1._28_2_ == 0;
    local_4b8.pointer =
         (WirePointer *)local_478.exception.ptr.field_1.value.ownFile.content.disposer;
    if (bVar19) {
      local_4b8.pointer = (WirePointer *)(Event *)0x0;
    }
    local_4b8.nestingLimit = 0x7fffffff;
    if (!bVar19) {
      local_4b8.nestingLimit = local_478.exception.ptr.field_1.value.line;
    }
    local_4b8.segment._0_4_ = 0;
    local_4b8.segment._4_4_ = 0;
    uVar20 = 0;
    uVar21 = 0;
    if (!bVar19) {
      local_4b8.segment._0_4_ = local_478.exception.ptr._0_4_;
      local_4b8.segment._4_4_ = local_478.exception.ptr._4_4_;
      uVar20 = local_478.exception.ptr.field_1._0_4_;
      uVar21 = local_478.exception.ptr.field_1._4_4_;
    }
    local_4b8.capTable = (CapTableReader *)CONCAT44(uVar21,uVar20);
    _local_4d0 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_4b8,(void *)0x0,0)
    ;
    pcVar15 = 
    "\"failed: expected \" \"(\\\"bar\\\") == (client.callHeldRequest().send().wait(context.waitScope).getS())\", \"bar\", client.callHeldRequest().send().wait(context.waitScope).getS()"
    ;
    in_R8D = 0x4d94da;
    kj::_::Debug::log<char_const(&)[93],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2ed,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (client.callHeldRequest().send().wait(context.waitScope).getS())\", \"bar\", client.callHeldRequest().send().wait(context.waitScope).getS()"
               ,(char (*) [93])
                "failed: expected (\"bar\") == (client.callHeldRequest().send().wait(context.waitScope).getS())"
               ,(char (*) [4])0x4e245b,(Reader *)local_4d0);
    uVar5 = local_478.exception.ptr.field_1.value.description.content.size_;
    if ((long *)local_478.exception.ptr.field_1.value.description.content.size_ != (long *)0x0) {
      local_478.exception.ptr.field_1.value.description.content.size_ = 0;
      (*(code *)**(undefined8 **)local_478.exception.ptr.field_1.value.description.content.ptr)
                (local_478.exception.ptr.field_1.value.description.content.ptr,
                 uVar5 + *(long *)(*(long *)uVar5 + -0x10));
    }
    p_Var16 = p_Stack_530;
    ppEVar3 = local_538;
    if (local_538 != (Event **)0x0) {
      local_538 = (Event **)0x0;
      p_Stack_530 = (_Base_ptr)0x0;
      p_Var14 = p_Var16;
      (*(code *)local_528->errorHandler->_vptr_ErrorHandler)(local_528,ppEVar3,8,p_Var16,p_Var16,0);
      in_R8D = (int)p_Var14;
      pcVar15 = (char *)p_Var16;
    }
    pTVar2 = local_540;
    if (local_540 != (TestNetworkAdapter *)0x0) {
      local_540 = (TestNetworkAdapter *)0x0;
      (**local_548->_vptr_Event)
                (local_548,
                 (long)&(pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                        _vptr_VatNetworkBase +
                 (long)((Event *)
                       (pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                       _vptr_VatNetworkBase)[-1].prev);
    }
    pTVar12 = pTStack_550;
    if (pTStack_550 != (TransformPromiseNodeBase *)0x0) {
      pTStack_550 = (TransformPromiseNodeBase *)0x0;
      (*(code *)((SegmentReader *)local_558)->arena->_vptr_Arena)
                (local_558,
                 (pTVar12->super_PromiseNode)._vptr_PromiseNode[-2] +
                 (long)&pTVar12->super_PromiseNode);
    }
    p_Var16 = local_4f0;
    if (local_4f0 != (_Base_ptr)0x0) {
      local_4f0 = (_Base_ptr)0x0;
      (***(_func_int ***)p_Stack_4f8)
                (p_Stack_4f8,*(long *)(*(long *)p_Var16 + -0x10) + (long)&p_Var16->_M_color);
    }
  }
  local_1d8.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::getHeldRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
              *)local_520,(Client *)local_4e8,&local_1d8);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
          *)local_558,(int)local_520,__buf_03,(size_t)pcVar15,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>_>
              *)&local_478,local_558);
  bVar19 = local_478.exception.ptr.field_1._28_2_ != 0;
  local_4b8.pointer = (WirePointer *)(Event *)0x0;
  if (bVar19) {
    local_4b8.pointer =
         (WirePointer *)local_478.exception.ptr.field_1.value.ownFile.content.disposer;
  }
  p_Var16 = (_Base_ptr)0x7fffffff;
  if (bVar19) {
    p_Var16 = (_Base_ptr)(ulong)(uint)local_478.exception.ptr.field_1.value.line;
  }
  local_4b8.segment._0_4_ = 0;
  local_4b8.segment._4_4_ = 0;
  uVar20 = 0;
  uVar21 = 0;
  if (bVar19) {
    local_4b8.segment._0_4_ = local_478.exception.ptr._0_4_;
    local_4b8.segment._4_4_ = local_478.exception.ptr._4_4_;
    uVar20 = local_478.exception.ptr.field_1._0_4_;
    uVar21 = local_478.exception.ptr.field_1._4_4_;
  }
  local_4b8.capTable = (CapTableReader *)CONCAT44(uVar21,uVar20);
  local_4b8.nestingLimit = (int)p_Var16;
  OVar23 = PointerReader::getCapability((PointerReader *)&local_2e8);
  uVar5 = local_478.exception.ptr.field_1.value.description.content.size_;
  local_4c8._0_4_ = local_2e8.ptr._0_4_;
  local_4c8._4_4_ = local_2e8.ptr._4_4_;
  p_Stack_4c0 = (_Base_ptr)local_2e8.size_;
  local_4d0 = (undefined1  [8])&Capability::Client::typeinfo;
  if ((long *)local_478.exception.ptr.field_1.value.description.content.size_ != (long *)0x0) {
    local_478.exception.ptr.field_1.value.description.content.size_ = 0;
    (*(code *)**(undefined8 **)local_478.exception.ptr.field_1.value.description.content.ptr)
              (local_478.exception.ptr.field_1.value.description.content.ptr,
               uVar5 + *(long *)(*(long *)uVar5 + -0x10),OVar23.ptr);
  }
  p_Var14 = p_Stack_530;
  ppEVar3 = local_538;
  if (local_538 != (Event **)0x0) {
    local_538 = (Event **)0x0;
    p_Stack_530 = (_Base_ptr)0x0;
    p_Var16 = p_Var14;
    (*(code *)local_528->errorHandler->_vptr_ErrorHandler)(local_528,ppEVar3,8,p_Var14,p_Var14,0);
    in_R8D = (int)p_Var16;
    p_Var16 = p_Var14;
  }
  pTVar2 = local_540;
  if (local_540 != (TestNetworkAdapter *)0x0) {
    local_540 = (TestNetworkAdapter *)0x0;
    (**local_548->_vptr_Event)
              (local_548,
               (long)&(pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                      _vptr_VatNetworkBase +
               (long)((Event *)
                     (pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                     _vptr_VatNetworkBase)[-1].prev);
  }
  pTVar12 = pTStack_550;
  if (pTStack_550 != (TransformPromiseNodeBase *)0x0) {
    pTStack_550 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_558)->arena->_vptr_Arena)
              (local_558,
               (pTVar12->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&pTVar12->super_PromiseNode);
  }
  p_Var14 = local_4f0;
  if (local_4f0 != (_Base_ptr)0x0) {
    local_4f0 = (_Base_ptr)0x0;
    (***(_func_int ***)p_Stack_4f8)
              (p_Stack_4f8,*(long *)(*(long *)p_Var14 + -0x10) + (long)&p_Var14->_M_color);
  }
  local_48c = (local_148.clientNetwork)->sent;
  local_1f0.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_558,(Client *)local_4d0,&local_1f0);
  *(undefined4 *)&local_548->_vptr_Event = 0x7b;
  pbVar1 = (byte *)((long)&local_548->_vptr_Event + 4);
  *pbVar1 = *pbVar1 | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)local_520,(int)local_558,__buf_04,(size_t)p_Var16,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &local_478,local_520);
  bVar19 = local_478.exception.ptr.field_1._28_2_ == 0;
  local_4b8.pointer = (WirePointer *)local_478.exception.ptr.field_1.value.ownFile.content.disposer;
  if (bVar19) {
    local_4b8.pointer = (WirePointer *)(Event *)0x0;
  }
  p_Var16 = (_Base_ptr)0x7fffffff;
  if (!bVar19) {
    p_Var16 = (_Base_ptr)(ulong)(uint)local_478.exception.ptr.field_1.value.line;
  }
  local_4b8.segment._0_4_ = 0;
  local_4b8.segment._4_4_ = 0;
  uVar20 = 0;
  uVar21 = 0;
  if (!bVar19) {
    local_4b8.segment._0_4_ = local_478.exception.ptr._0_4_;
    local_4b8.segment._4_4_ = local_478.exception.ptr._4_4_;
    uVar20 = local_478.exception.ptr.field_1._0_4_;
    uVar21 = local_478.exception.ptr.field_1._4_4_;
  }
  local_4b8.capTable = (CapTableReader *)CONCAT44(uVar21,uVar20);
  local_4b8.nestingLimit = (int)p_Var16;
  RVar24 = PointerReader::getBlob<capnp::Text>(&local_4b8,(void *)0x0,0);
  uVar5 = local_478.exception.ptr.field_1.value.description.content.size_;
  pvVar18 = RVar24.super_StringPtr.content.size_;
  bVar19 = true;
  if (pvVar18 == (void *)0x4) {
    uVar13 = *RVar24.super_StringPtr.content.ptr ^ 0x6f66;
    p_Var16 = (_Base_ptr)(ulong)uVar13;
    bVar19 = (char)RVar24.super_StringPtr.content.ptr[1] != 'o' || (short)uVar13 != 0;
  }
  if ((long *)local_478.exception.ptr.field_1.value.description.content.size_ != (long *)0x0) {
    local_478.exception.ptr.field_1.value.description.content.size_ = 0;
    (*(code *)**(undefined8 **)local_478.exception.ptr.field_1.value.description.content.ptr)
              (local_478.exception.ptr.field_1.value.description.content.ptr,
               uVar5 + *(long *)(*(long *)uVar5 + -0x10));
    pvVar18 = extraout_RDX_02;
  }
  p_Var17 = p_Stack_4f8;
  p_Var14 = local_500;
  if (local_500 != (_Base_ptr)0x0) {
    local_500 = (_Base_ptr)0x0;
    p_Stack_4f8 = (_Base_ptr)0x0;
    p_Var16 = p_Var17;
    (*(code *)**(undefined8 **)local_4f0)(local_4f0,p_Var14,8,p_Var17,p_Var17,0);
    in_R8D = (int)p_Var16;
    p_Var16 = p_Var17;
    pvVar18 = extraout_RDX_03;
  }
  pWVar7 = local_508;
  if (local_508 != (WirePointer *)0x0) {
    local_508 = (WirePointer *)0x0;
    (**(code **)*local_510)
              (local_510,(long)&(pWVar7->offsetAndKind).value + *(long *)((long)*pWVar7 + -0x10));
    pvVar18 = extraout_RDX_04;
  }
  uVar5 = local_520._8_8_;
  if ((ClientHook *)local_520._8_8_ != (ClientHook *)0x0) {
    local_520._8_8_ = (ClientHook *)0x0;
    (**(code **)*(EventPort **)local_520._0_8_)
              (local_520._0_8_,
               ((CapTableReader *)uVar5)->_vptr_CapTableReader[-2] + (long)(CapTableReader *)uVar5);
    pvVar18 = extraout_RDX_05;
  }
  if ((bool)(bVar19 & kj::_::Debug::minSeverity < 3)) {
    Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
    ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
            *)local_520,(int)local_558,pvVar18,
           CONCAT71((int7)((ulong)p_Var16 >> 8),kj::_::Debug::minSeverity < 3),in_R8D);
    kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
              ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
               &local_478,local_520);
    bVar19 = local_478.exception.ptr.field_1._28_2_ == 0;
    local_4b8.pointer =
         (WirePointer *)local_478.exception.ptr.field_1.value.ownFile.content.disposer;
    if (bVar19) {
      local_4b8.pointer = (WirePointer *)(Event *)0x0;
    }
    local_4b8.nestingLimit = 0x7fffffff;
    if (!bVar19) {
      local_4b8.nestingLimit = local_478.exception.ptr.field_1.value.line;
    }
    local_4b8.segment._0_4_ = 0;
    local_4b8.segment._4_4_ = 0;
    uVar20 = 0;
    uVar21 = 0;
    if (!bVar19) {
      local_4b8.segment._0_4_ = local_478.exception.ptr._0_4_;
      local_4b8.segment._4_4_ = local_478.exception.ptr._4_4_;
      uVar20 = local_478.exception.ptr.field_1._0_4_;
      uVar21 = local_478.exception.ptr.field_1._4_4_;
    }
    local_4b8.capTable = (CapTableReader *)CONCAT44(uVar21,uVar20);
    local_2e8 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_4b8,(void *)0x0,0);
    in_R8D = 0x4d95c0;
    kj::_::Debug::log<char_const(&)[76],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2f9,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (request.send().wait(context.waitScope).getX())\", \"foo\", request.send().wait(context.waitScope).getX()"
               ,(char (*) [76])
                "failed: expected (\"foo\") == (request.send().wait(context.waitScope).getX())",
               (char (*) [4])0x4da3ec,(Reader *)&local_2e8);
    uVar5 = local_478.exception.ptr.field_1.value.description.content.size_;
    if ((long *)local_478.exception.ptr.field_1.value.description.content.size_ != (long *)0x0) {
      local_478.exception.ptr.field_1.value.description.content.size_ = 0;
      (*(code *)**(undefined8 **)local_478.exception.ptr.field_1.value.description.content.ptr)
                (local_478.exception.ptr.field_1.value.description.content.ptr,
                 uVar5 + *(long *)(*(long *)uVar5 + -0x10));
    }
    p_Var14 = p_Stack_4f8;
    p_Var16 = local_500;
    if (local_500 != (_Base_ptr)0x0) {
      local_500 = (_Base_ptr)0x0;
      p_Stack_4f8 = (_Base_ptr)0x0;
      (*(code *)**(undefined8 **)local_4f0)(local_4f0,p_Var16,8,p_Var14,p_Var14,0);
      in_R8D = (int)p_Var14;
    }
    pWVar7 = local_508;
    if (local_508 != (WirePointer *)0x0) {
      local_508 = (WirePointer *)0x0;
      (**(code **)*local_510)
                (local_510,(long)&(pWVar7->offsetAndKind).value + *(long *)((long)*pWVar7 + -0x10));
    }
    uVar5 = local_520._8_8_;
    if ((ClientHook *)local_520._8_8_ != (ClientHook *)0x0) {
      local_520._8_8_ = (ClientHook *)0x0;
      (**(code **)*(EventPort **)local_520._0_8_)
                (local_520._0_8_,
                 ((CapTableReader *)uVar5)->_vptr_CapTableReader[-2] + (long)(CapTableReader *)uVar5
                );
    }
  }
  uVar13 = (local_148.clientNetwork)->sent;
  pcVar15 = (char *)(ulong)uVar13;
  if ((local_48c != uVar13) && (kj::_::Debug::minSeverity < 3)) {
    pcVar15 = 
    "\"failed: expected \" \"(oldSentCount) == (context.clientNetwork.getSentCount())\", oldSentCount, context.clientNetwork.getSentCount()"
    ;
    in_R8D = 0x4d968f;
    local_478.exception.ptr._0_4_ = uVar13;
    kj::_::Debug::log<char_const(&)[74],unsigned_int&,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2fa,ERROR,
               "\"failed: expected \" \"(oldSentCount) == (context.clientNetwork.getSentCount())\", oldSentCount, context.clientNetwork.getSentCount()"
               ,(char (*) [74])
                "failed: expected (oldSentCount) == (context.clientNetwork.getSentCount())",
               &local_48c,(uint *)&local_478);
  }
  pTVar4 = local_528;
  if (local_528 != (TaskSet *)0x0) {
    local_528 = (TaskSet *)0x0;
    (***(_func_int ***)p_Stack_530)
              (p_Stack_530,
               (long)pTVar4->errorHandler[-2]._vptr_ErrorHandler + (long)&pTVar4->errorHandler);
  }
  local_208.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::callFooRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
              *)local_558,(Client *)local_4e8,&local_208);
  pTVar12 = pTStack_550;
  local_478.exception.ptr._0_4_ = local_558._0_4_;
  local_478.exception.ptr._4_4_ = local_558._4_4_;
  local_478.exception.ptr.field_1._0_1_ = pTStack_550._0_1_;
  local_478.exception.ptr.field_1._1_1_ = pTStack_550._1_1_;
  local_478.exception.ptr.field_1._2_2_ = pTStack_550._2_2_;
  local_478.exception.ptr.field_1._4_4_ = pTStack_550._4_4_;
  local_478.exception.ptr.field_1.value.ownFile.content.size_ = (size_t)local_540;
  pTStack_550 = pTVar12;
  (**(code **)(**(long **)(local_4d0 + 8 + (long)((_Base_ptr)((long)local_4d0 + -0x20))->_M_parent)
              + 0x20))(local_520);
  PointerBuilder::setCapability((PointerBuilder *)&local_478,(Own<capnp::ClientHook> *)local_520);
  uVar5 = local_520._8_8_;
  pvVar18 = extraout_RDX_06;
  if ((ClientHook *)local_520._8_8_ != (ClientHook *)0x0) {
    local_520._8_8_ = (ClientHook *)0x0;
    (**(code **)*(EventPort **)local_520._0_8_)
              (local_520._0_8_,
               ((CapTableReader *)uVar5)->_vptr_CapTableReader[-2] + (long)(CapTableReader *)uVar5);
    pvVar18 = extraout_RDX_07;
  }
  Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
          *)local_520,(int)local_558,pvVar18,(size_t)pcVar15,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>
              *)&local_478,local_520);
  bVar19 = local_478.exception.ptr.field_1._28_2_ == 0;
  local_4b8.pointer = (WirePointer *)local_478.exception.ptr.field_1.value.ownFile.content.disposer;
  if (bVar19) {
    local_4b8.pointer = (WirePointer *)(Event *)0x0;
  }
  pcVar15 = (char *)0x7fffffff;
  if (!bVar19) {
    pcVar15 = (char *)(ulong)(uint)local_478.exception.ptr.field_1.value.line;
  }
  uVar20._0_1_ = false;
  uVar20._1_1_ = false;
  uVar20._2_2_ = 0;
  local_4b8.segment._0_4_ = 0;
  local_4b8.segment._4_4_ = 0;
  uVar21 = 0;
  if (!bVar19) {
    local_4b8.segment._0_4_ = local_478.exception.ptr._0_4_;
    local_4b8.segment._4_4_ = local_478.exception.ptr._4_4_;
    uVar20 = local_478.exception.ptr.field_1._0_4_;
    uVar21 = local_478.exception.ptr.field_1._4_4_;
  }
  local_4b8.capTable = (CapTableReader *)CONCAT44(uVar21,uVar20);
  local_4b8.nestingLimit = (int)pcVar15;
  RVar24 = PointerReader::getBlob<capnp::Text>(&local_4b8,(void *)0x0,0);
  uVar5 = local_478.exception.ptr.field_1.value.description.content.size_;
  pvVar18 = RVar24.super_StringPtr.content.size_;
  bVar19 = true;
  if (pvVar18 == (void *)0x4) {
    uVar13 = *RVar24.super_StringPtr.content.ptr ^ 0x6162;
    pcVar15 = (char *)(ulong)uVar13;
    bVar19 = (char)RVar24.super_StringPtr.content.ptr[1] != 'r' || (short)uVar13 != 0;
  }
  if ((long *)local_478.exception.ptr.field_1.value.description.content.size_ != (long *)0x0) {
    local_478.exception.ptr.field_1.value.description.content.size_ = 0;
    (*(code *)**(undefined8 **)local_478.exception.ptr.field_1.value.description.content.ptr)
              (local_478.exception.ptr.field_1.value.description.content.ptr,
               uVar5 + *(long *)(*(long *)uVar5 + -0x10));
    pvVar18 = extraout_RDX_08;
  }
  p_Var14 = p_Stack_4f8;
  p_Var16 = local_500;
  if (local_500 != (_Base_ptr)0x0) {
    local_500 = (_Base_ptr)0x0;
    p_Stack_4f8 = (_Base_ptr)0x0;
    p_Var17 = p_Var14;
    (*(code *)**(undefined8 **)local_4f0)(local_4f0,p_Var16,8,p_Var14,p_Var14,0);
    in_R8D = (int)p_Var17;
    pcVar15 = (char *)p_Var14;
    pvVar18 = extraout_RDX_09;
  }
  pWVar7 = local_508;
  if (local_508 != (WirePointer *)0x0) {
    local_508 = (WirePointer *)0x0;
    (**(code **)*local_510)
              (local_510,(long)&(pWVar7->offsetAndKind).value + *(long *)((long)*pWVar7 + -0x10));
    pvVar18 = extraout_RDX_10;
  }
  uVar5 = local_520._8_8_;
  if ((ClientHook *)local_520._8_8_ != (ClientHook *)0x0) {
    local_520._8_8_ = (ClientHook *)0x0;
    (**(code **)*(EventPort **)local_520._0_8_)
              (local_520._0_8_,
               ((CapTableReader *)uVar5)->_vptr_CapTableReader[-2] + (long)(CapTableReader *)uVar5);
    pvVar18 = extraout_RDX_11;
  }
  if ((bool)(bVar19 & kj::_::Debug::minSeverity < 3)) {
    Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
    ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
            *)local_520,(int)local_558,pvVar18,(size_t)pcVar15,in_R8D);
    kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>::wait
              ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>
                *)&local_478,local_520);
    bVar19 = local_478.exception.ptr.field_1._28_2_ == 0;
    local_4b8.pointer =
         (WirePointer *)local_478.exception.ptr.field_1.value.ownFile.content.disposer;
    if (bVar19) {
      local_4b8.pointer = (WirePointer *)(Event *)0x0;
    }
    local_4b8.nestingLimit = 0x7fffffff;
    if (!bVar19) {
      local_4b8.nestingLimit = local_478.exception.ptr.field_1.value.line;
    }
    uVar21._0_1_ = false;
    uVar21._1_1_ = false;
    uVar21._2_2_ = 0;
    local_4b8.segment._0_4_ = 0;
    local_4b8.segment._4_4_ = 0;
    uVar20 = 0;
    if (!bVar19) {
      local_4b8.segment._0_4_ = local_478.exception.ptr._0_4_;
      local_4b8.segment._4_4_ = local_478.exception.ptr._4_4_;
      uVar21 = local_478.exception.ptr.field_1._0_4_;
      uVar20 = local_478.exception.ptr.field_1._4_4_;
    }
    local_4b8.capTable = (CapTableReader *)CONCAT44(uVar20,uVar21);
    local_2e8 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_4b8,(void *)0x0,0);
    pcVar15 = 
    "\"failed: expected \" \"(\\\"bar\\\") == (request.send().wait(context.waitScope).getS())\", \"bar\", request.send().wait(context.waitScope).getS()"
    ;
    in_R8D = 0x4d9762;
    kj::_::Debug::log<char_const(&)[76],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x301,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (request.send().wait(context.waitScope).getS())\", \"bar\", request.send().wait(context.waitScope).getS()"
               ,(char (*) [76])
                "failed: expected (\"bar\") == (request.send().wait(context.waitScope).getS())",
               (char (*) [4])0x4e245b,(Reader *)&local_2e8);
    uVar5 = local_478.exception.ptr.field_1.value.description.content.size_;
    if ((long *)local_478.exception.ptr.field_1.value.description.content.size_ != (long *)0x0) {
      local_478.exception.ptr.field_1.value.description.content.size_ = 0;
      (*(code *)**(undefined8 **)local_478.exception.ptr.field_1.value.description.content.ptr)
                (local_478.exception.ptr.field_1.value.description.content.ptr,
                 uVar5 + *(long *)(*(long *)uVar5 + -0x10));
    }
    p_Var14 = p_Stack_4f8;
    p_Var16 = local_500;
    if (local_500 != (_Base_ptr)0x0) {
      local_500 = (_Base_ptr)0x0;
      p_Stack_4f8 = (_Base_ptr)0x0;
      p_Var17 = p_Var14;
      (*(code *)**(undefined8 **)local_4f0)(local_4f0,p_Var16,8,p_Var14,p_Var14,0);
      in_R8D = (int)p_Var17;
      pcVar15 = (char *)p_Var14;
    }
    pWVar7 = local_508;
    if (local_508 != (WirePointer *)0x0) {
      local_508 = (WirePointer *)0x0;
      (**(code **)*local_510)
                (local_510,(long)&(pWVar7->offsetAndKind).value + *(long *)((long)*pWVar7 + -0x10));
    }
    uVar5 = local_520._8_8_;
    if ((ClientHook *)local_520._8_8_ != (ClientHook *)0x0) {
      local_520._8_8_ = (ClientHook *)0x0;
      (**(code **)*(EventPort **)local_520._0_8_)
                (local_520._0_8_,
                 ((CapTableReader *)uVar5)->_vptr_CapTableReader[-2] + (long)(CapTableReader *)uVar5
                );
    }
  }
  pTVar4 = local_528;
  if (local_528 != (TaskSet *)0x0) {
    local_528 = (TaskSet *)0x0;
    (***(_func_int ***)p_Stack_530)
              (p_Stack_530,
               (long)pTVar4->errorHandler[-2]._vptr_ErrorHandler + (long)&pTVar4->errorHandler);
  }
  p_Var16 = p_Stack_4c0;
  if (p_Stack_4c0 != (_Base_ptr)0x0) {
    p_Stack_4c0 = (_Base_ptr)0x0;
    (*(code *)**(undefined8 **)local_4c8)
              (local_4c8,(long)&p_Var16->_M_color + *(long *)(*(long *)p_Var16 + -0x10));
  }
  local_220.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_520,
             (Client *)
             (&((Client *)local_4e8)->field_0x0 +
             (long)*(pointer_____offset_0x10___ *)(local_4e8._0_8_ + -0x20)),&local_220);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_558,(int)local_520,__buf_05,(size_t)pcVar15,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_478,local_558);
  uVar5 = local_478.exception.ptr.field_1.value.description.content.size_;
  bVar19 = true;
  if (0x1f < (uint)local_478.exception.ptr.field_1._24_4_) {
    bVar19 = *(int *)local_478.exception.ptr.field_1.value.ownFile.content.size_ != 5;
  }
  if ((long *)local_478.exception.ptr.field_1.value.description.content.size_ != (long *)0x0) {
    local_478.exception.ptr.field_1.value.description.content.size_ = 0;
    (*(code *)**(undefined8 **)local_478.exception.ptr.field_1.value.description.content.ptr)
              (local_478.exception.ptr.field_1.value.description.content.ptr,
               uVar5 + *(long *)(*(long *)uVar5 + -0x10));
  }
  p_Var16 = p_Stack_530;
  ppEVar3 = local_538;
  if (local_538 != (Event **)0x0) {
    local_538 = (Event **)0x0;
    p_Stack_530 = (_Base_ptr)0x0;
    p_Var14 = p_Var16;
    (*(code *)local_528->errorHandler->_vptr_ErrorHandler)(local_528,ppEVar3,8,p_Var16,p_Var16,0);
    in_R8D = (int)p_Var14;
    pcVar15 = (char *)p_Var16;
  }
  pTVar2 = local_540;
  if (local_540 != (TestNetworkAdapter *)0x0) {
    local_540 = (TestNetworkAdapter *)0x0;
    (**local_548->_vptr_Event)
              (local_548,
               (long)&(pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                      _vptr_VatNetworkBase +
               (long)((Event *)
                     (pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                     _vptr_VatNetworkBase)[-1].prev);
  }
  pTVar12 = pTStack_550;
  if (pTStack_550 != (TransformPromiseNodeBase *)0x0) {
    pTStack_550 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_558)->arena->_vptr_Arena)
              (local_558,
               (pTVar12->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&pTVar12->super_PromiseNode);
  }
  p_Var16 = local_4f0;
  if (local_4f0 != (_Base_ptr)0x0) {
    local_4f0 = (_Base_ptr)0x0;
    (***(_func_int ***)p_Stack_4f8)
              (p_Stack_4f8,*(long *)(*(long *)p_Var16 + -0x10) + (long)&p_Var16->_M_color);
  }
  if ((bool)(bVar19 & kj::_::Debug::minSeverity < 3)) {
    local_4b8.segment._0_4_ = 5;
    local_238.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                *)local_520,
               (Client *)
               (&((Client *)local_4e8)->field_0x0 +
               (long)*(pointer_____offset_0x10___ *)(local_4e8._0_8_ + -0x20)),&local_238);
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
            *)local_558,(int)local_520,__buf_06,(size_t)pcVar15,in_R8D);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_478,local_558);
    iVar11 = 0;
    if (0x1f < (uint)local_478.exception.ptr.field_1._24_4_) {
      iVar11 = *(int *)local_478.exception.ptr.field_1.value.ownFile.content.size_;
    }
    local_4d0._0_4_ = iVar11;
    pcVar15 = 
    "\"failed: expected \" \"(5) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 5, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
    ;
    in_R8D = 0x4d985d;
    kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x306,ERROR,
               "\"failed: expected \" \"(5) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 5, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
               ,(char (*) [96])
                "failed: expected (5) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
               ,(int *)&local_4b8,(uint *)local_4d0);
    uVar5 = local_478.exception.ptr.field_1.value.description.content.size_;
    if ((long *)local_478.exception.ptr.field_1.value.description.content.size_ != (long *)0x0) {
      local_478.exception.ptr.field_1.value.description.content.size_ = 0;
      (*(code *)**(undefined8 **)local_478.exception.ptr.field_1.value.description.content.ptr)
                (local_478.exception.ptr.field_1.value.description.content.ptr,
                 uVar5 + *(long *)(*(long *)uVar5 + -0x10));
    }
    p_Var16 = p_Stack_530;
    ppEVar3 = local_538;
    if (local_538 != (Event **)0x0) {
      local_538 = (Event **)0x0;
      p_Stack_530 = (_Base_ptr)0x0;
      p_Var14 = p_Var16;
      (*(code *)local_528->errorHandler->_vptr_ErrorHandler)(local_528,ppEVar3,8,p_Var16,p_Var16,0);
      in_R8D = (int)p_Var14;
      pcVar15 = (char *)p_Var16;
    }
    pTVar2 = local_540;
    if (local_540 != (TestNetworkAdapter *)0x0) {
      local_540 = (TestNetworkAdapter *)0x0;
      (**local_548->_vptr_Event)
                (local_548,
                 (long)&(pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                        _vptr_VatNetworkBase +
                 (long)((Event *)
                       (pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                       _vptr_VatNetworkBase)[-1].prev);
    }
    pTVar12 = pTStack_550;
    if (pTStack_550 != (TransformPromiseNodeBase *)0x0) {
      pTStack_550 = (TransformPromiseNodeBase *)0x0;
      (*(code *)((SegmentReader *)local_558)->arena->_vptr_Arena)
                (local_558,
                 (pTVar12->super_PromiseNode)._vptr_PromiseNode[-2] +
                 (long)&pTVar12->super_PromiseNode);
    }
    p_Var16 = local_4f0;
    if (local_4f0 != (_Base_ptr)0x0) {
      local_4f0 = (_Base_ptr)0x0;
      (***(_func_int ***)p_Stack_4f8)
                (p_Stack_4f8,*(long *)(*(long *)p_Var16 + -0x10) + (long)&p_Var16->_M_color);
    }
  }
  local_250.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_520,
             (Client *)
             (&((Client *)local_4e8)->field_0x0 +
             (long)*(pointer_____offset_0x10___ *)(local_4e8._0_8_ + -0x20)),&local_250);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_558,(int)local_520,__buf_07,(size_t)pcVar15,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_478,local_558);
  uVar5 = local_478.exception.ptr.field_1.value.description.content.size_;
  bVar19 = true;
  if (0x1f < (uint)local_478.exception.ptr.field_1._24_4_) {
    bVar19 = *(int *)local_478.exception.ptr.field_1.value.ownFile.content.size_ != 6;
  }
  if ((long *)local_478.exception.ptr.field_1.value.description.content.size_ != (long *)0x0) {
    local_478.exception.ptr.field_1.value.description.content.size_ = 0;
    (*(code *)**(undefined8 **)local_478.exception.ptr.field_1.value.description.content.ptr)
              (local_478.exception.ptr.field_1.value.description.content.ptr,
               uVar5 + *(long *)(*(long *)uVar5 + -0x10));
  }
  p_Var16 = p_Stack_530;
  ppEVar3 = local_538;
  if (local_538 != (Event **)0x0) {
    local_538 = (Event **)0x0;
    p_Stack_530 = (_Base_ptr)0x0;
    p_Var14 = p_Var16;
    (*(code *)local_528->errorHandler->_vptr_ErrorHandler)(local_528,ppEVar3,8,p_Var16,p_Var16,0);
    in_R8D = (int)p_Var14;
    pcVar15 = (char *)p_Var16;
  }
  pTVar2 = local_540;
  if (local_540 != (TestNetworkAdapter *)0x0) {
    local_540 = (TestNetworkAdapter *)0x0;
    (**local_548->_vptr_Event)
              (local_548,
               (long)&(pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                      _vptr_VatNetworkBase +
               (long)((Event *)
                     (pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                     _vptr_VatNetworkBase)[-1].prev);
  }
  pTVar12 = pTStack_550;
  if (pTStack_550 != (TransformPromiseNodeBase *)0x0) {
    pTStack_550 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_558)->arena->_vptr_Arena)
              (local_558,
               (pTVar12->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&pTVar12->super_PromiseNode);
  }
  p_Var16 = local_4f0;
  if (local_4f0 != (_Base_ptr)0x0) {
    local_4f0 = (_Base_ptr)0x0;
    (***(_func_int ***)p_Stack_4f8)
              (p_Stack_4f8,*(long *)(*(long *)p_Var16 + -0x10) + (long)&p_Var16->_M_color);
  }
  if ((bool)(bVar19 & kj::_::Debug::minSeverity < 3)) {
    local_4b8.segment._0_4_ = 6;
    local_268.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                *)local_520,
               (Client *)
               (&((Client *)local_4e8)->field_0x0 +
               (long)*(pointer_____offset_0x10___ *)(local_4e8._0_8_ + -0x20)),&local_268);
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
            *)local_558,(int)local_520,__buf_08,(size_t)pcVar15,in_R8D);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_478,local_558);
    iVar11 = 0;
    if (0x1f < (uint)local_478.exception.ptr.field_1._24_4_) {
      iVar11 = *(int *)local_478.exception.ptr.field_1.value.ownFile.content.size_;
    }
    local_4d0._0_4_ = iVar11;
    pcVar15 = 
    "\"failed: expected \" \"(6) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 6, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
    ;
    in_R8D = 0x4d996c;
    kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x307,ERROR,
               "\"failed: expected \" \"(6) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 6, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
               ,(char (*) [96])
                "failed: expected (6) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
               ,(int *)&local_4b8,(uint *)local_4d0);
    uVar5 = local_478.exception.ptr.field_1.value.description.content.size_;
    if ((long *)local_478.exception.ptr.field_1.value.description.content.size_ != (long *)0x0) {
      local_478.exception.ptr.field_1.value.description.content.size_ = 0;
      (*(code *)**(undefined8 **)local_478.exception.ptr.field_1.value.description.content.ptr)
                (local_478.exception.ptr.field_1.value.description.content.ptr,
                 uVar5 + *(long *)(*(long *)uVar5 + -0x10));
    }
    p_Var16 = p_Stack_530;
    ppEVar3 = local_538;
    if (local_538 != (Event **)0x0) {
      local_538 = (Event **)0x0;
      p_Stack_530 = (_Base_ptr)0x0;
      p_Var14 = p_Var16;
      (*(code *)local_528->errorHandler->_vptr_ErrorHandler)(local_528,ppEVar3,8,p_Var16,p_Var16,0);
      in_R8D = (int)p_Var14;
      pcVar15 = (char *)p_Var16;
    }
    pTVar2 = local_540;
    if (local_540 != (TestNetworkAdapter *)0x0) {
      local_540 = (TestNetworkAdapter *)0x0;
      (**local_548->_vptr_Event)
                (local_548,
                 (long)&(pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                        _vptr_VatNetworkBase +
                 (long)((Event *)
                       (pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                       _vptr_VatNetworkBase)[-1].prev);
    }
    pTVar12 = pTStack_550;
    if (pTStack_550 != (TransformPromiseNodeBase *)0x0) {
      pTStack_550 = (TransformPromiseNodeBase *)0x0;
      (*(code *)((SegmentReader *)local_558)->arena->_vptr_Arena)
                (local_558,
                 (pTVar12->super_PromiseNode)._vptr_PromiseNode[-2] +
                 (long)&pTVar12->super_PromiseNode);
    }
    p_Var16 = local_4f0;
    if (local_4f0 != (_Base_ptr)0x0) {
      local_4f0 = (_Base_ptr)0x0;
      (***(_func_int ***)p_Stack_4f8)
                (p_Stack_4f8,*(long *)(*(long *)p_Var16 + -0x10) + (long)&p_Var16->_M_color);
    }
  }
  local_280.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_520,
             (Client *)
             (&((Client *)local_4e8)->field_0x0 +
             (long)*(pointer_____offset_0x10___ *)(local_4e8._0_8_ + -0x20)),&local_280);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_558,(int)local_520,__buf_09,(size_t)pcVar15,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_478,local_558);
  uVar5 = local_478.exception.ptr.field_1.value.description.content.size_;
  bVar19 = true;
  if (0x1f < (uint)local_478.exception.ptr.field_1._24_4_) {
    bVar19 = *(int *)local_478.exception.ptr.field_1.value.ownFile.content.size_ != 7;
  }
  if ((long *)local_478.exception.ptr.field_1.value.description.content.size_ != (long *)0x0) {
    local_478.exception.ptr.field_1.value.description.content.size_ = 0;
    (*(code *)**(undefined8 **)local_478.exception.ptr.field_1.value.description.content.ptr)
              (local_478.exception.ptr.field_1.value.description.content.ptr,
               uVar5 + *(long *)(*(long *)uVar5 + -0x10));
  }
  p_Var16 = p_Stack_530;
  ppEVar3 = local_538;
  if (local_538 != (Event **)0x0) {
    local_538 = (Event **)0x0;
    p_Stack_530 = (_Base_ptr)0x0;
    p_Var14 = p_Var16;
    (*(code *)local_528->errorHandler->_vptr_ErrorHandler)(local_528,ppEVar3,8,p_Var16,p_Var16,0);
    in_R8D = (int)p_Var14;
    pcVar15 = (char *)p_Var16;
  }
  pTVar2 = local_540;
  if (local_540 != (TestNetworkAdapter *)0x0) {
    local_540 = (TestNetworkAdapter *)0x0;
    (**local_548->_vptr_Event)
              (local_548,
               (long)&(pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                      _vptr_VatNetworkBase +
               (long)((Event *)
                     (pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                     _vptr_VatNetworkBase)[-1].prev);
  }
  pTVar12 = pTStack_550;
  if (pTStack_550 != (TransformPromiseNodeBase *)0x0) {
    pTStack_550 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_558)->arena->_vptr_Arena)
              (local_558,
               (pTVar12->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&pTVar12->super_PromiseNode);
  }
  p_Var16 = local_4f0;
  if (local_4f0 != (_Base_ptr)0x0) {
    local_4f0 = (_Base_ptr)0x0;
    (***(_func_int ***)p_Stack_4f8)
              (p_Stack_4f8,*(long *)(*(long *)p_Var16 + -0x10) + (long)&p_Var16->_M_color);
  }
  __n = CONCAT71((int7)((ulong)pcVar15 >> 8),kj::_::Debug::minSeverity < 3);
  if ((bool)(bVar19 & kj::_::Debug::minSeverity < 3)) {
    local_4b8.segment._0_4_ = 7;
    local_298.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                *)local_520,
               (Client *)
               (&((Client *)local_4e8)->field_0x0 +
               (long)*(pointer_____offset_0x10___ *)(local_4e8._0_8_ + -0x20)),&local_298);
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
            *)local_558,(int)local_520,__buf_10,__n,in_R8D);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_478,local_558);
    iVar11 = 0;
    if (0x1f < (uint)local_478.exception.ptr.field_1._24_4_) {
      iVar11 = *(int *)local_478.exception.ptr.field_1.value.ownFile.content.size_;
    }
    local_4d0._0_4_ = iVar11;
    kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x308,ERROR,
               "\"failed: expected \" \"(7) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 7, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
               ,(char (*) [96])
                "failed: expected (7) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
               ,(int *)&local_4b8,(uint *)local_4d0);
    uVar5 = local_478.exception.ptr.field_1.value.description.content.size_;
    if ((long *)local_478.exception.ptr.field_1.value.description.content.size_ != (long *)0x0) {
      local_478.exception.ptr.field_1.value.description.content.size_ = 0;
      (*(code *)**(undefined8 **)local_478.exception.ptr.field_1.value.description.content.ptr)
                (local_478.exception.ptr.field_1.value.description.content.ptr,
                 uVar5 + *(long *)(*(long *)uVar5 + -0x10));
    }
    p_Var16 = p_Stack_530;
    ppEVar3 = local_538;
    if (local_538 != (Event **)0x0) {
      local_538 = (Event **)0x0;
      p_Stack_530 = (_Base_ptr)0x0;
      (*(code *)local_528->errorHandler->_vptr_ErrorHandler)(local_528,ppEVar3,8,p_Var16,p_Var16,0);
    }
    pTVar2 = local_540;
    if (local_540 != (TestNetworkAdapter *)0x0) {
      local_540 = (TestNetworkAdapter *)0x0;
      (**local_548->_vptr_Event)
                (local_548,
                 (long)&(pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                        _vptr_VatNetworkBase +
                 (long)((Event *)
                       (pTVar2->super_TestNetworkAdapterBase).super_VatNetworkBase.
                       _vptr_VatNetworkBase)[-1].prev);
    }
    pTVar12 = pTStack_550;
    if (pTStack_550 != (TransformPromiseNodeBase *)0x0) {
      pTStack_550 = (TransformPromiseNodeBase *)0x0;
      (*(code *)((SegmentReader *)local_558)->arena->_vptr_Arena)
                (local_558,
                 (pTVar12->super_PromiseNode)._vptr_PromiseNode[-2] +
                 (long)&pTVar12->super_PromiseNode);
    }
    p_Var16 = local_4f0;
    if (local_4f0 != (_Base_ptr)0x0) {
      local_4f0 = (_Base_ptr)0x0;
      (***(_func_int ***)p_Stack_4f8)
                (p_Stack_4f8,*(long *)(*(long *)p_Var16 + -0x10) + (long)&p_Var16->_M_color);
    }
  }
  if ((local_559 == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[30]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x30b,ERROR,"\"failed: expected \" \"!(destroyed)\"",
               (char (*) [30])"failed: expected !(destroyed)");
  }
  plVar6 = plStack_4d8;
  if (plStack_4d8 != (long *)0x0) {
    plStack_4d8 = (long *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_4e8._12_4_,local_4e8._8_4_))
              ((undefined8 *)CONCAT44(local_4e8._12_4_,local_4e8._8_4_),
               (long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  local_478.exception.ptr._0_4_ = local_478.exception.ptr._0_4_ & 0xffffff00;
  local_318 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_488,&local_478,&local_148.waitScope);
  if (local_318 == '\x01') {
    if ((kj)local_478.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_478.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_478.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_478.exception.ptr.field_1.value,0);
  }
  if ((kj)local_478.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_478.exception.ptr.field_1.value);
  }
  if ((local_559 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x311,ERROR,"\"failed: expected \" \"destroyed\"",
               (char (*) [27])"failed: expected destroyed");
  }
  uVar5 = local_488._8_8_;
  if ((_func_int **)local_488._8_8_ != (_func_int **)0x0) {
    local_488._8_8_ = (_func_int **)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_488._4_4_,local_488._0_4_))
              ((undefined8 *)CONCAT44(local_488._4_4_,local_488._0_4_),
               uVar5 + *(long *)(*(_func_int **)uVar5 + -0x10));
  }
  pPVar10 = local_2f8.ptr;
  if (local_2f8.ptr != (PromiseFulfiller<void> *)0x0) {
    local_2f8.ptr = (PromiseFulfiller<void> *)0x0;
    (**(local_2f8.disposer)->_vptr_Disposer)
              (local_2f8.disposer,
               pPVar10->_vptr_PromiseFulfiller[-2] + (long)&pPVar10->_vptr_PromiseFulfiller);
  }
  pPVar9 = local_308.ptr;
  if (local_308.ptr != (PromiseNode *)0x0) {
    local_308.ptr = (PromiseNode *)0x0;
    (**(local_308.disposer)->_vptr_Disposer)
              (local_308.disposer,pPVar9->_vptr_PromiseNode[-2] + (long)&pPVar9->_vptr_PromiseNode);
  }
  TestContext::~TestContext(&local_148);
  return;
}

Assistant:

TEST(Rpc, RetainAndRelease) {
  TestContext context;

  auto paf = kj::newPromiseAndFulfiller<void>();
  bool destroyed = false;
  auto destructionPromise = paf.promise.then([&]() { destroyed = true; }).eagerlyEvaluate(nullptr);

  {
    auto client = context.connect(test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF)
        .castAs<test::TestMoreStuff>();

    {
      auto request = client.holdRequest();
      request.setCap(kj::heap<TestCapDestructor>(kj::mv(paf.fulfiller)));
      request.send().wait(context.waitScope);
    }

    // Do some other call to add a round trip.
    EXPECT_EQ(1, client.getCallSequenceRequest().send().wait(context.waitScope).getN());

    // Shouldn't be destroyed because it's being held by the server.
    EXPECT_FALSE(destroyed);

    // We can ask it to call the held capability.
    EXPECT_EQ("bar", client.callHeldRequest().send().wait(context.waitScope).getS());

    {
      // We can get the cap back from it.
      auto capCopy = client.getHeldRequest().send().wait(context.waitScope).getCap();

      {
        // And call it, without any network communications.
        uint oldSentCount = context.clientNetwork.getSentCount();
        auto request = capCopy.fooRequest();
        request.setI(123);
        request.setJ(true);
        EXPECT_EQ("foo", request.send().wait(context.waitScope).getX());
        EXPECT_EQ(oldSentCount, context.clientNetwork.getSentCount());
      }

      {
        // We can send another copy of the same cap to another method, and it works.
        auto request = client.callFooRequest();
        request.setCap(capCopy);
        EXPECT_EQ("bar", request.send().wait(context.waitScope).getS());
      }
    }

    // Give some time to settle.
    EXPECT_EQ(5, client.getCallSequenceRequest().send().wait(context.waitScope).getN());
    EXPECT_EQ(6, client.getCallSequenceRequest().send().wait(context.waitScope).getN());
    EXPECT_EQ(7, client.getCallSequenceRequest().send().wait(context.waitScope).getN());

    // Can't be destroyed, we haven't released it.
    EXPECT_FALSE(destroyed);
  }

  // We released our client, which should cause the server to be released, which in turn will
  // release the cap pointing back to us.
  destructionPromise.wait(context.waitScope);
  EXPECT_TRUE(destroyed);
}